

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

void __thiscall Vault::JwtStrategy::~JwtStrategy(JwtStrategy *this)

{
  JwtStrategy *this_local;
  
  (this->super_AuthenticationStrategy)._vptr_AuthenticationStrategy =
       (_func_int **)&PTR__JwtStrategy_0026d660;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&this->mount_);
  Tiny<Vault::JwtDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&this->jwt_);
  Tiny<Vault::RoleIdDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&this->role_);
  AuthenticationStrategy::~AuthenticationStrategy(&this->super_AuthenticationStrategy);
  return;
}

Assistant:

JwtStrategy(RoleId role, Jwt jwt)
    : role_(std::move(role))
    , jwt_(std::move(jwt))
    , mount_(Path{"jwt"})
  {}